

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O0

bool __thiscall Nibbler::getName(Nibbler *this,string *result)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  string local_48 [32];
  ulong local_28;
  size_type i;
  string *result_local;
  Nibbler *this_local;
  
  local_28 = this->_cursor;
  if (local_28 < this->_length) {
    i = (size_type)result;
    result_local = &this->_input;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
    iVar1 = isdigit((int)*pcVar2);
    if (iVar1 == 0) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
      iVar1 = ispunct((int)*pcVar2);
      if (iVar1 == 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
        iVar1 = isspace((int)*pcVar2);
        if (iVar1 == 0) {
          do {
            local_28 = local_28 + 1;
            bVar3 = false;
            if (local_28 < this->_length) {
              pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
              iVar1 = ispunct((int)*pcVar2);
              bVar3 = false;
              if (iVar1 == 0) {
                pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
                iVar1 = isspace((int)*pcVar2);
                bVar3 = iVar1 == 0;
              }
            }
          } while (bVar3);
        }
      }
    }
    if (this->_cursor < local_28) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)this);
      std::__cxx11::string::operator=((string *)i,local_48);
      std::__cxx11::string::~string(local_48);
      this->_cursor = local_28;
      return true;
    }
  }
  return false;
}

Assistant:

bool Nibbler::getName (std::string& result)
{
  std::string::size_type i = _cursor;

  if (i < _length)
  {
    if (! isdigit (_input[i]) &&
        ! ispunct (_input[i]) &&
        ! isspace (_input[i]))
    {
      ++i;
      while (i < _length &&
             ! ispunct (_input[i]) &&
             ! isspace (_input[i]))
      {
        ++i;
      }
    }

    if (i > _cursor)
    {
      result = _input.substr (_cursor, i - _cursor);
      _cursor = i;
      return true;
    }
  }

  return false;
}